

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.cpp
# Opt level: O0

void __thiscall InliningThreshold::SetAggressiveHeuristics(InliningThreshold *this)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  undefined4 *puVar4;
  int limit;
  InliningThreshold *this_local;
  
  if ((this->forLoopBody & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningHeuristics.cpp"
                       ,0x11,"(!this->forLoopBody)","!this->forLoopBody");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar2 = DAT_01ea9f5c;
  this->inlineThreshold = DAT_01ea9f5c;
  this->constructorInlineThreshold = iVar2;
  this->outsideLoopInlineThreshold = iVar2;
  this->leafInlineThreshold = iVar2;
  this->loopInlineThreshold = iVar2;
  this->polymorphicInlineThreshold = iVar2;
  this->maxNumberOfInlineesWithLoop = DAT_01eace5c;
  this->inlineCountMax = DAT_01ea9f58;
  return;
}

Assistant:

void InliningThreshold::SetAggressiveHeuristics()
{
    Assert(!this->forLoopBody);
    int limit = CONFIG_FLAG(AggressiveInlineThreshold);

    inlineThreshold = limit;
    constructorInlineThreshold = limit;
    outsideLoopInlineThreshold = limit;
    leafInlineThreshold = limit;
    loopInlineThreshold = limit;
    polymorphicInlineThreshold = limit;
    maxNumberOfInlineesWithLoop = CONFIG_FLAG(MaxNumberOfInlineesWithLoop);

    inlineCountMax = CONFIG_FLAG(AggressiveInlineCountMax);
}